

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get-model.cpp
# Opt level: O0

char * get_model_or_exit(int argc,char **argv)

{
  size_t sVar1;
  long in_RSI;
  int in_EDI;
  char *model_path;
  char *local_18;
  
  if (in_EDI < 2) {
    local_18 = getenv("LLAMACPP_TEST_MODELFILE");
    if ((local_18 == (char *)0x0) || (sVar1 = strlen(local_18), sVar1 == 0)) {
      fprintf(_stderr,
              "\x1b[33mWARNING: No model file provided. Skipping this test. Set LLAMACPP_TEST_MODELFILE=<gguf_model_path> to silence this warning and run this test.\n\x1b[0m"
             );
      exit(0);
    }
  }
  else {
    local_18 = *(char **)(in_RSI + 8);
  }
  return local_18;
}

Assistant:

char * get_model_or_exit(int argc, char *argv[]) {
    char * model_path;
    if (argc > 1) {
        model_path = argv[1];

    } else {
        model_path = getenv("LLAMACPP_TEST_MODELFILE");
        if (!model_path || strlen(model_path) == 0) {
            fprintf(stderr, "\033[33mWARNING: No model file provided. Skipping this test. Set LLAMACPP_TEST_MODELFILE=<gguf_model_path> to silence this warning and run this test.\n\033[0m");
            exit(EXIT_SUCCESS);
        }
    }

    return model_path;
}